

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  uchar *puVar1;
  uchar uVar2;
  size_t len_local;
  uchar *start_local;
  uchar **p_local;
  
  uVar2 = (uchar)len;
  if (len < 0x80) {
    if ((long)*p - (long)start < 1) {
      p_local._4_4_ = -0x6c;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = uVar2;
      p_local._4_4_ = 1;
    }
  }
  else if (len < 0x100) {
    if ((long)*p - (long)start < 2) {
      p_local._4_4_ = -0x6c;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = uVar2;
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = 0x81;
      p_local._4_4_ = 2;
    }
  }
  else if ((long)*p - (long)start < 3) {
    p_local._4_4_ = -0x6c;
  }
  else {
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = uVar2;
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)(len >> 8);
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = 0x82;
    p_local._4_4_ = 3;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_len( unsigned char **p, unsigned char *start, size_t len )
{
    if( len < 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        return( 1 );
    }

    if( len <= 0xFF )
    {
        if( *p - start < 2 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        *--(*p) = 0x81;
        return( 2 );
    }

    if( *p - start < 3 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    // We assume we never have lengths larger than 65535 bytes
    //
    *--(*p) = len % 256;
    *--(*p) = ( len / 256 ) % 256;
    *--(*p) = 0x82;

    return( 3 );
}